

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtypes.c
# Opt level: O2

fourcc_t StringToFourCC(tchar_t *In,bool_t Upper)

{
  fourcc_t fVar1;
  undefined8 in_RAX;
  ulong uVar2;
  tchar_t s [5];
  
  if (*In != '\0') {
    _s = in_RAX;
    tcscpy_s(s,5,In);
    if (Upper != 0) {
      tcsupr(s);
    }
    for (uVar2 = 1; uVar2 < 4; uVar2 = uVar2 + 1) {
      if (s[uVar2] == '\0') {
        memset(s + uVar2,0x5f,4 - uVar2);
        uVar2 = 4;
      }
    }
    fVar1._0_1_ = s[0];
    fVar1._1_1_ = s[1];
    fVar1._2_1_ = s[2];
    fVar1._3_1_ = s[3];
    return fVar1;
  }
  return 0;
}

Assistant:

fourcc_t StringToFourCC(const tchar_t* In, bool_t Upper)
{
    tchar_t s[4+1];
    size_t i;

    if (!In[0])
        return 0;

    tcscpy_s(s,TSIZEOF(s),In);

    if (Upper)
        tcsupr(s);

    for (i=1;i<4;++i)
        if (!s[i])
            for (;i<4;++i)
                s[i] = '_';

    return FOURCC((uint8_t)s[0],(uint8_t)s[1],(uint8_t)s[2],(uint8_t)s[3]);
}